

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

Expression * __thiscall
soul::HEARTGenerator::evaluateAsExpression(HEARTGenerator *this,Expression *e)

{
  Allocator *pAVar1;
  Expression *lhs_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Constant *pCVar5;
  Constant *pCVar6;
  VariableRef *pVVar7;
  VariableDeclaration *pVVar8;
  StructMemberRef *pSVar9;
  ArrayElementRef *pAVar10;
  TypeCast *pTVar11;
  size_t sVar12;
  CommaSeparatedList *pCVar13;
  pool_ref<soul::AST::Expression> *ppVar14;
  undefined4 extraout_var;
  ArraySize AVar15;
  BinaryOperator *pBVar16;
  UnaryOperator *pUVar17;
  Expression *pEVar18;
  Expression *pEVar19;
  ProcessorProperty *pPVar20;
  ProcessorProperty *pPVar21;
  HEARTGenerator *pHVar22;
  CompileMessage local_200;
  pool_ptr<soul::AST::ProcessorProperty> local_1c8;
  pool_ptr<soul::AST::ProcessorProperty> pp;
  Expression *source_3;
  Type sourceType_1;
  pool_ptr<soul::AST::UnaryOperator> op_1;
  CodeLocation local_170;
  Expression *local_160;
  Expression *rhs;
  Expression *lhs;
  Type operandType;
  pool_ptr<soul::AST::BinaryOperator> op;
  Type *sourceType;
  Expression *sourceExp;
  pool_ptr<soul::AST::CommaSeparatedList> local_118;
  pool_ptr<soul::AST::CommaSeparatedList> list;
  pool_ref<soul::AST::Expression> source_2;
  pool_ptr<soul::AST::TypeCast> c_1;
  Expression *source_1;
  Type arrayOrVectorType;
  pool_ptr<soul::AST::ArrayElementRef> subscript;
  Expression *source;
  Type structType;
  pool_ptr<soul::AST::StructMemberRef> member;
  pool_ptr<soul::AST::Expression> local_98;
  pool_ptr<soul::AST::Expression> initial;
  pool_ptr<soul::heart::Variable> a;
  Scope local_50;
  Scope local_48;
  pool_ptr<soul::AST::VariableRef> local_40;
  pool_ptr<soul::AST::VariableRef> v;
  pool_ptr<soul::AST::Constant> local_28;
  pool_ptr<soul::AST::Constant> c;
  Expression *e_local;
  HEARTGenerator *this_local;
  
  uVar3 = this->expressionDepth + 1;
  this->expressionDepth = uVar3;
  c.object = (Constant *)e;
  if (this->maxExpressionDepth <= uVar3) goto LAB_0041bbea;
  (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28);
  v.object._0_1_ = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (v.object._0_1_) {
    pAVar1 = this->module->allocator;
    pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_28);
    pCVar6 = pool_ptr<soul::AST::Constant>::operator->(&local_28);
    this_local = (HEARTGenerator *)
                 heart::Allocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                           (pAVar1,&(pCVar5->super_Expression).super_Statement.super_ASTObject.
                                    context.location,&pCVar6->value);
  }
  v.object._1_3_ = 0;
  pool_ptr<soul::AST::Constant>::~pool_ptr(&local_28);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::VariableRef,soul::AST::Expression>
            ((soul *)&local_40,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_40);
  if (bVar2) {
    pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
    pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar7->variable);
    bVar2 = AST::VariableDeclaration::isAssignable(pVVar8);
    if (bVar2) {
      pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
      pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar7->variable);
      AST::ASTObject::getParentScope((ASTObject *)pVVar8);
      AST::Scope::findModule(&local_48);
      AST::ASTObject::getParentScope((ASTObject *)c.object);
      AST::Scope::findModule(&local_50);
      bVar2 = pool_ptr<soul::AST::ModuleBase>::operator!=
                        ((pool_ptr<soul::AST::ModuleBase> *)&local_48,
                         (pool_ptr<soul::AST::ModuleBase> *)&local_50);
      pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&local_50);
      pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&local_48);
      if (bVar2) {
        pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
        Errors::cannotReferenceOtherProcessorVar<>();
        AST::Context::throwError
                  (&(pVVar7->super_Expression).super_Statement.super_ASTObject.context,
                   (CompileMessage *)&a,false);
      }
    }
    pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
    pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar7->variable);
    initial.object = (Expression *)(pVVar8->generatedVariable).object;
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&initial);
    if (bVar2) {
      this_local = (HEARTGenerator *)
                   pool_ptr<soul::heart::Variable>::operator*
                             ((pool_ptr<soul::heart::Variable> *)&initial);
    }
    v.object._1_3_ = 0;
    v.object._0_1_ = bVar2;
    pool_ptr<soul::heart::Variable>::~pool_ptr((pool_ptr<soul::heart::Variable> *)&initial);
    if ((uint)v.object == 0) {
      pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
      pVVar8 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar7->variable);
      local_98.object = (pVVar8->initialValue).object;
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_98);
      if (bVar2) {
        pEVar18 = pool_ptr<soul::AST::Expression>::operator*(&local_98);
        this_local = (HEARTGenerator *)evaluateAsExpression(this,pEVar18);
      }
      v.object._1_3_ = 0;
      v.object._0_1_ = bVar2;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_98);
      if ((uint)v.object == 0) {
        pVVar7 = pool_ptr<soul::AST::VariableRef>::operator->(&local_40);
        (*(pVVar7->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&member);
        this_local = (HEARTGenerator *)
                     BlockBuilder::createZeroInitialiser
                               (&(this->builder).super_BlockBuilder,(Type *)&member);
        Type::~Type((Type *)&member);
        v.object._0_4_ = 1;
      }
    }
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::VariableRef>::~pool_ptr(&local_40);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::StructMemberRef,soul::AST::Expression>
            ((soul *)&structType.structure,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&structType.structure);
  if (bVar2) {
    pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator*
                       ((pool_ptr<soul::AST::StructMemberRef> *)&structType.structure);
    getStructType((Type *)&source,this,pSVar9);
    pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator->
                       ((pool_ptr<soul::AST::StructMemberRef> *)&structType.structure);
    pEVar18 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pSVar9->object);
    pEVar19 = evaluateAsExpression(this,pEVar18,(Type *)&source);
    pSVar9 = pool_ptr<soul::AST::StructMemberRef>::operator*
                       ((pool_ptr<soul::AST::StructMemberRef> *)&structType.structure);
    this_local = (HEARTGenerator *)createStructSubElement(this,pSVar9,pEVar19);
    v.object._0_4_ = 1;
    Type::~Type((Type *)&source);
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::StructMemberRef>::~pool_ptr
            ((pool_ptr<soul::AST::StructMemberRef> *)&structType.structure);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>
            ((soul *)&arrayOrVectorType.structure,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&arrayOrVectorType.structure);
  if (bVar2) {
    pAVar10 = pool_ptr<soul::AST::ArrayElementRef>::operator*
                        ((pool_ptr<soul::AST::ArrayElementRef> *)&arrayOrVectorType.structure);
    getArrayOrVectorType((Type *)&source_1,this,pAVar10);
    pAVar10 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                        ((pool_ptr<soul::AST::ArrayElementRef> *)&arrayOrVectorType.structure);
    pEVar18 = pool_ptr<soul::AST::Expression>::operator*(&pAVar10->object);
    pEVar19 = evaluateAsExpression(this,pEVar18,(Type *)&source_1);
    pAVar10 = pool_ptr<soul::AST::ArrayElementRef>::operator*
                        ((pool_ptr<soul::AST::ArrayElementRef> *)&arrayOrVectorType.structure);
    this_local = (HEARTGenerator *)createArraySubElement(this,pAVar10,pEVar19);
    v.object._0_4_ = 1;
    Type::~Type((Type *)&source_1);
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr
            ((pool_ptr<soul::AST::ArrayElementRef> *)&arrayOrVectorType.structure);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::TypeCast,soul::AST::Expression>((soul *)&source_2,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&source_2);
  if (bVar2) {
    pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->((pool_ptr<soul::AST::TypeCast> *)&source_2);
    sVar12 = AST::TypeCast::getNumArguments(pTVar11);
    checkAssertion(sVar12 != 0,"c->getNumArguments() != 0","evaluateAsExpression",0x26b);
    pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->((pool_ptr<soul::AST::TypeCast> *)&source_2);
    list.object = (CommaSeparatedList *)(pTVar11->source).object;
    pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->((pool_ptr<soul::AST::TypeCast> *)&source_2);
    sourceExp = (Expression *)(pTVar11->source).object;
    cast<soul::AST::CommaSeparatedList,soul::AST::Expression>
              ((soul *)&local_118,(pool_ref<soul::AST::Expression> *)&sourceExp);
    pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&sourceExp);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_118);
    if (bVar2) {
      pCVar13 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_118);
      sVar12 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::size
                         (&pCVar13->items);
      if (sVar12 == 1) {
        pCVar13 = pool_ptr<soul::AST::CommaSeparatedList>::operator->(&local_118);
        ppVar14 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front
                            (&pCVar13->items);
        list.object = (CommaSeparatedList *)ppVar14->object;
        goto LAB_0041b2a4;
      }
      pTVar11 = pool_ptr<soul::AST::TypeCast>::operator*((pool_ptr<soul::AST::TypeCast> *)&source_2)
      ;
      this_local = (HEARTGenerator *)createAggregateWithInitialisers(this,pTVar11);
      v.object._0_4_ = 1;
    }
    else {
LAB_0041b2a4:
      v.object._0_4_ = 0;
    }
    pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_118);
    if ((uint)v.object == 0) {
      pEVar18 = pool_ref::operator_cast_to_Expression_((pool_ref *)&list);
      pEVar19 = evaluateAsExpression(this,pEVar18);
      iVar4 = (*(pEVar19->super_Object)._vptr_Object[2])();
      pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                          ((pool_ptr<soul::AST::TypeCast> *)&source_2);
      bVar2 = TypeRules::canCastTo(&pTVar11->targetType,(Type *)CONCAT44(extraout_var,iVar4));
      if (bVar2) {
        pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                            ((pool_ptr<soul::AST::TypeCast> *)&source_2);
        this_local = (HEARTGenerator *)
                     BlockBuilder::createCastIfNeeded
                               (&(this->builder).super_BlockBuilder,pEVar19,&pTVar11->targetType);
        v.object._0_4_ = 1;
      }
      else {
        pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                            ((pool_ptr<soul::AST::TypeCast> *)&source_2);
        bVar2 = Type::isFixedSizeAggregate(&pTVar11->targetType);
        if (bVar2) {
          pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                              ((pool_ptr<soul::AST::TypeCast> *)&source_2);
          AVar15 = Type::getNumAggregateElements(&pTVar11->targetType);
          if (AVar15 == 1) {
            pTVar11 = pool_ptr<soul::AST::TypeCast>::operator*
                                ((pool_ptr<soul::AST::TypeCast> *)&source_2);
            this_local = (HEARTGenerator *)createAggregateWithInitialisers(this,pTVar11);
            v.object._0_4_ = 1;
            goto LAB_0041b4f8;
          }
        }
        pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                            ((pool_ptr<soul::AST::TypeCast> *)&source_2);
        pEVar18 = pool_ref<soul::AST::Expression>::operator->(&pTVar11->source);
        pTVar11 = pool_ptr<soul::AST::TypeCast>::operator->
                            ((pool_ptr<soul::AST::TypeCast> *)&source_2);
        SanityCheckPass::expectCastPossible
                  (&(pEVar18->super_Statement).super_ASTObject.context,&pTVar11->targetType,
                   (Type *)CONCAT44(extraout_var,iVar4));
        v.object._0_4_ = 0;
      }
    }
LAB_0041b4f8:
    pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&list);
    if ((uint)v.object == 0) goto LAB_0041b520;
  }
  else {
LAB_0041b520:
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::TypeCast>::~pool_ptr((pool_ptr<soul::AST::TypeCast> *)&source_2);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::BinaryOperator,soul::AST::Expression>
            ((soul *)&operandType.structure,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&operandType.structure);
  if (bVar2) {
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    AST::BinaryOperator::getOperandType((Type *)&lhs,pBVar16);
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    pEVar18 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pBVar16->lhs);
    pEVar19 = evaluateAsExpression(this,pEVar18);
    rhs = BlockBuilder::createCastIfNeeded(&(this->builder).super_BlockBuilder,pEVar19,(Type *)&lhs)
    ;
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    pEVar18 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pBVar16->rhs);
    pEVar19 = evaluateAsExpression(this,pEVar18);
    local_160 = BlockBuilder::createCastIfNeeded
                          (&(this->builder).super_BlockBuilder,pEVar19,(Type *)&lhs);
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    CodeLocation::CodeLocation
              (&local_170,
               &(pBVar16->super_Expression).super_Statement.super_ASTObject.context.location);
    lhs_00 = rhs;
    pEVar19 = local_160;
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    pEVar19 = BlockBuilder::createBinaryOp
                        (&(this->builder).super_BlockBuilder,&local_170,lhs_00,pEVar19,
                         pBVar16->operation);
    pBVar16 = pool_ptr<soul::AST::BinaryOperator>::operator->
                        ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
    (*(pBVar16->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&op_1);
    this_local = (HEARTGenerator *)
                 BlockBuilder::createCastIfNeeded
                           (&(this->builder).super_BlockBuilder,pEVar19,(Type *)&op_1);
    Type::~Type((Type *)&op_1);
    CodeLocation::~CodeLocation(&local_170);
    v.object._0_4_ = 1;
    Type::~Type((Type *)&lhs);
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::BinaryOperator>::~pool_ptr
            ((pool_ptr<soul::AST::BinaryOperator> *)&operandType.structure);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::UnaryOperator,soul::AST::Expression>
            ((soul *)&sourceType_1.structure,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&sourceType_1.structure);
  if (bVar2) {
    pUVar17 = pool_ptr<soul::AST::UnaryOperator>::operator->
                        ((pool_ptr<soul::AST::UnaryOperator> *)&sourceType_1.structure);
    (*(pUVar17->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&source_3);
    pUVar17 = pool_ptr<soul::AST::UnaryOperator>::operator->
                        ((pool_ptr<soul::AST::UnaryOperator> *)&sourceType_1.structure);
    pEVar18 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pUVar17->source);
    pEVar19 = evaluateAsExpression(this,pEVar18);
    pEVar19 = BlockBuilder::createCastIfNeeded
                        (&(this->builder).super_BlockBuilder,pEVar19,(Type *)&source_3);
    pUVar17 = pool_ptr<soul::AST::UnaryOperator>::operator->
                        ((pool_ptr<soul::AST::UnaryOperator> *)&sourceType_1.structure);
    CodeLocation::CodeLocation
              ((CodeLocation *)&pp,
               &(pUVar17->super_Expression).super_Statement.super_ASTObject.context.location);
    pUVar17 = pool_ptr<soul::AST::UnaryOperator>::operator->
                        ((pool_ptr<soul::AST::UnaryOperator> *)&sourceType_1.structure);
    this_local = (HEARTGenerator *)
                 BlockBuilder::createUnaryOp
                           (&(this->builder).super_BlockBuilder,(CodeLocation *)&pp,pEVar19,
                            pUVar17->operation);
    CodeLocation::~CodeLocation((CodeLocation *)&pp);
    v.object._0_4_ = 1;
    Type::~Type((Type *)&source_3);
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::UnaryOperator>::~pool_ptr
            ((pool_ptr<soul::AST::UnaryOperator> *)&sourceType_1.structure);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
  cast<soul::AST::ProcessorProperty,soul::AST::Expression>
            ((soul *)&local_1c8,&(c.object)->super_Expression);
  bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1c8);
  if (bVar2) {
    bVar2 = Module::isNamespace(this->module);
    if (bVar2) {
      pPVar20 = pool_ptr<soul::AST::ProcessorProperty>::operator->(&local_1c8);
      Errors::processorPropertyUsedOutsideDecl<>();
      AST::Context::throwError
                (&(pPVar20->super_Expression).super_Statement.super_ASTObject.context,&local_200,
                 false);
    }
    pAVar1 = this->module->allocator;
    pPVar20 = pool_ptr<soul::AST::ProcessorProperty>::operator->(&local_1c8);
    pPVar21 = pool_ptr<soul::AST::ProcessorProperty>::operator->(&local_1c8);
    this_local = (HEARTGenerator *)
                 heart::Allocator::
                 allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                           (pAVar1,&(pPVar20->super_Expression).super_Statement.super_ASTObject.
                                    context.location,
                            (Property *)&(pPVar21->super_Expression).field_0x2c);
    v.object._0_4_ = 1;
  }
  else {
    v.object._0_4_ = 0;
  }
  pool_ptr<soul::AST::ProcessorProperty>::~pool_ptr(&local_1c8);
  if ((uint)v.object != 0) {
    return (Expression *)this_local;
  }
LAB_0041bbea:
  pHVar22 = (HEARTGenerator *)getExpressionAsConstLocalCopy(this,&(c.object)->super_Expression);
  return (Expression *)pHVar22;
}

Assistant:

heart::Expression& evaluateAsExpression (AST::Expression& e)
    {
        if (++expressionDepth < maxExpressionDepth)
        {
            if (auto c = e.getAsConstant())
                return module.allocator.allocate<heart::Constant> (c->context.location, c->value);

            if (auto v = cast<AST::VariableRef> (e))
            {
                if (v->variable->isAssignable())
                    if (v->variable->getParentScope()->findModule() != e.getParentScope()->findModule())
                        v->context.throwError (Errors::cannotReferenceOtherProcessorVar());

                if (auto a = v->variable->generatedVariable)
                    return *a;

                if (auto initial = v->variable->initialValue)
                    return evaluateAsExpression (*initial);

                return builder.createZeroInitialiser (v->getResultType());
            }

            if (auto member = cast<AST::StructMemberRef> (e))
            {
                auto structType = getStructType (*member);

                auto& source = evaluateAsExpression (member->object, structType);
                return createStructSubElement (*member, source);
            }

            if (auto subscript = cast<AST::ArrayElementRef> (e))
            {
                auto arrayOrVectorType = getArrayOrVectorType (*subscript);
                auto& source = evaluateAsExpression (*subscript->object, arrayOrVectorType);
                return createArraySubElement (*subscript, source);
            }

            if (auto c = cast<AST::TypeCast> (e))
            {
                SOUL_ASSERT (c->getNumArguments() != 0);

                pool_ref<AST::Expression> source = c->source;

                if (auto list = cast<AST::CommaSeparatedList> (c->source))
                {
                    if (list->items.size() != 1)
                        return createAggregateWithInitialisers (*c);

                    source = list->items.front();
                }

                auto& sourceExp = evaluateAsExpression (source);
                const auto& sourceType = sourceExp.getType();

                if (TypeRules::canCastTo (c->targetType, sourceType))
                    return builder.createCastIfNeeded (sourceExp, c->targetType);

                if (c->targetType.isFixedSizeAggregate() && c->targetType.getNumAggregateElements() == 1)
                    return createAggregateWithInitialisers (*c);

                SanityCheckPass::expectCastPossible (c->source->context, c->targetType, sourceType);
            }

            if (auto op = cast<AST::BinaryOperator> (e))
            {
                auto operandType = op->getOperandType();

                // (putting these into locals to make sure we evaluate everything in left-to-right order)
                auto& lhs = builder.createCastIfNeeded (evaluateAsExpression (op->lhs), operandType);
                auto& rhs = builder.createCastIfNeeded (evaluateAsExpression (op->rhs), operandType);

                return builder.createCastIfNeeded (builder.createBinaryOp (op->context.location, lhs, rhs, op->operation),
                                                   op->getResultType());
            }

            if (auto op = cast<AST::UnaryOperator> (e))
            {
                auto sourceType = op->getResultType();
                auto& source = builder.createCastIfNeeded (evaluateAsExpression (op->source), sourceType);
                return builder.createUnaryOp (op->context.location, source, op->operation);
            }

            if (auto pp = cast<AST::ProcessorProperty> (e))
            {
                if (module.isNamespace())
                    pp->context.throwError (Errors::processorPropertyUsedOutsideDecl());

                return module.allocator.allocate<heart::ProcessorProperty> (pp->context.location, pp->property);
            }
        }

        return getExpressionAsConstLocalCopy (e);
    }